

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O1

int __thiscall
LASreadItemCompressed_BYTE_v2::init(LASreadItemCompressed_BYTE_v2 *this,EVP_PKEY_CTX *ctx)

{
  size_t __n;
  void *pvVar1;
  ulong uVar2;
  
  __n = (size_t)this->number;
  if (this->number != 0) {
    uVar2 = 0;
    do {
      ArithmeticDecoder::initSymbolModel(this->dec,this->m_byte[uVar2],(U32 *)0x0);
      uVar2 = uVar2 + 1;
      __n = (size_t)this->number;
    } while (uVar2 < __n);
  }
  pvVar1 = memcpy(this->last_item,ctx,__n);
  return (int)CONCAT71((int7)((ulong)pvVar1 >> 8),1);
}

Assistant:

BOOL LASreadItemCompressed_BYTE_v2::init(const U8* item, U32& context)
{
  U32 i;
  /* init state */

  /* init models and integer compressors */
  for (i = 0; i < number; i++)
  {
    dec->initSymbolModel(m_byte[i]);
  }

  /* init last item */
  memcpy(last_item, item, number);
  return TRUE;
}